

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O2

V2f __thiscall Imf_2_5::LatLongMap::latLong(LatLongMap *this,V3f *dir)

{
  V2f VVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Db;
  
  fVar5 = dir->y;
  fVar3 = SQRT(dir->z * dir->z + dir->x * dir->x);
  fVar4 = Imath_2_5::Vec3<float>::length(dir);
  if (ABS(fVar5) <= fVar3) {
    fVar5 = asinf(fVar5 / fVar4);
  }
  else {
    fVar5 = acosf(fVar3 / fVar4);
    uVar2 = -(uint)(0.0 < dir->y);
    fVar5 = (float)(uVar2 & 0x3f800000 | ~uVar2 & -(uint)(dir->y < 0.0) & 0xbf800000) * fVar5;
  }
  fVar3 = dir->x;
  fVar4 = dir->z;
  fVar6 = 0.0;
  fVar7 = 0.0;
  if ((((fVar4 != 0.0) || (NAN(fVar4))) || (fVar3 != 0.0)) || (NAN(fVar3))) {
    fVar6 = atan2f(fVar3,fVar4);
    fVar7 = extraout_XMM0_Db;
  }
  *(float *)this = fVar5;
  *(float *)(this + 4) = fVar6;
  VVar1.y = fVar7;
  VVar1.x = fVar6;
  return VVar1;
}

Assistant:

V2f	
latLong (const V3f &dir)
{
    float r = sqrt (dir.z * dir.z + dir.x * dir.x);

    float latitude = (r < abs (dir.y))?
			 acos (r / dir.length()) * sign (dir.y):
			 asin (dir.y / dir.length());

    float longitude = (dir.z == 0 && dir.x == 0)? 0: atan2 (dir.x, dir.z);

    return V2f (latitude, longitude);
}